

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnmdec.c
# Opt level: O2

int ReadPNM(uint8_t *data,size_t data_size,WebPPicture *pic,int keep_alpha,Metadata *metadata)

{
  bool bVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  uint8_t uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  uint8_t *__dest;
  uint8_t *puVar10;
  size_t sVar11;
  ushort **ppuVar12;
  ulong uVar13;
  long lVar14;
  uint64_t uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  char *pcVar19;
  ulong uVar20;
  uint8_t *__ptr;
  uint8_t *puVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  undefined4 local_8e4;
  ulong local_8e0;
  uint8_t *local_8d8;
  size_t local_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  undefined8 local_8b8;
  uint local_8b0;
  int local_8a8;
  int local_8a4;
  uint8_t *local_8a0;
  uint64_t local_898;
  ulong local_890;
  size_t local_888;
  long local_880;
  size_t local_878;
  size_t local_870;
  long local_868;
  uint8_t *local_860;
  ulong local_858;
  size_t out_size;
  char out_1 [1025];
  char out [1025];
  
  local_8d8 = data;
  local_8d0 = data_size;
  if ((data == (uint8_t *)0x0) || (data_size < 3)) {
LAB_001090f1:
    fwrite("Error parsing PNM header.\n",0x1a,1,_stderr);
  }
  else {
    local_8b0 = 0;
    local_8c8 = 0;
    uStack_8c0 = 0;
    local_8b8 = 0xffffffff00000000;
    sVar9 = ReadLine(data,0,data_size,out,&local_888);
    if ((sVar9 == 0) || (iVar6 = __isoc99_sscanf(out,"P%d",(long)&local_8b8 + 4), iVar6 != 1))
    goto LAB_001090f1;
    if (local_8b8._4_4_ == 7) {
      local_8e0 = CONCAT44(local_8e0._4_4_,0xffffffff);
      while (sVar9 = ReadLine(local_8d8,sVar9,local_8d0,out_1,&out_size), sVar9 != 0) {
        iVar6 = __isoc99_sscanf(out_1,"WIDTH %d",&local_8e4);
        if (iVar6 == 1) {
          if ((local_8b0 & 1) != 0) {
            pcVar19 = "WIDTH";
LAB_00108d88:
            FlagError(pcVar19);
            break;
          }
          local_8b0 = local_8b0 | 1;
          local_8c8 = CONCAT44(local_8c8._4_4_,local_8e4);
        }
        else {
          iVar6 = __isoc99_sscanf(out_1,"HEIGHT %d",&local_8e4);
          if (iVar6 == 1) {
            if ((local_8b0 & 2) != 0) {
              pcVar19 = "HEIGHT";
              goto LAB_00108d88;
            }
            local_8b0 = local_8b0 | 2;
            local_8c8 = CONCAT44(local_8e4,(uint)local_8c8);
          }
          else {
            iVar6 = __isoc99_sscanf(out_1,"DEPTH %d",&local_8e4);
            if (iVar6 == 1) {
              if ((local_8b0 & 4) != 0) {
                pcVar19 = "DEPTH";
                goto LAB_00108d88;
              }
              local_8b0 = local_8b0 | 4;
              uStack_8c0 = CONCAT44(local_8e4,(int)uStack_8c0);
            }
            else {
              iVar6 = __isoc99_sscanf(out_1,"MAXVAL %d",&local_8e4);
              if (iVar6 == 1) {
                if ((local_8b0 & 8) != 0) {
                  pcVar19 = "MAXVAL";
                  goto LAB_00108d88;
                }
                local_8b0 = local_8b0 | 8;
                local_8b8 = CONCAT44(local_8b8._4_4_,local_8e4);
              }
              else {
                iVar6 = bcmp(out_1,"TUPLTYPE RGB_ALPHA",0x13);
                if (iVar6 != 0) {
                  iVar6 = bcmp(out_1,"TUPLTYPE RGB",0xd);
                  if (iVar6 == 0) {
                    local_8b0 = local_8b0 | 0x10;
                    uVar2 = 3;
                    goto LAB_00108c9c;
                  }
                  iVar6 = bcmp(out_1,"TUPLTYPE GRAYSCALE_ALPHA",0x19);
                  if (iVar6 == 0) {
                    local_8b0 = local_8b0 | 0x10;
                    uVar2 = 2;
                    goto LAB_00108c9c;
                  }
                  iVar6 = bcmp(out_1,"TUPLTYPE GRAYSCALE",0x13);
                  if (iVar6 == 0) {
                    local_8b0 = local_8b0 | 0x10;
                    uVar2 = 1;
                    goto LAB_00108c9c;
                  }
                  iVar6 = bcmp(out_1,"ENDHDR",7);
                  if (iVar6 != 0) {
                    if (0x14 < out_size) {
                      builtin_strncpy(out_1 + 0x10," ...",5);
                    }
                    for (lVar14 = 0; sVar11 = strlen(out_1), lVar14 < (int)sVar11;
                        lVar14 = lVar14 + 1) {
                      ppuVar12 = __ctype_b_loc();
                      if ((*(byte *)((long)*ppuVar12 + (long)out_1[lVar14] * 2 + 1) & 0x40) == 0) {
                        out_1[lVar14] = ' ';
                      }
                    }
                    fprintf(_stderr,"PAM header error: unrecognized entry [%s]\n",out_1);
LAB_00109307:
                    sVar9 = 0;
                    goto LAB_00108da2;
                  }
                  if ((local_8b0 & 0xf) == 0) {
                    fprintf(_stderr,"PAM header error: missing tags%s%s%s%s\n"," WIDTH"," HEIGHT",
                            " DEPTH"," MAXVAL");
                    goto LAB_00109307;
                  }
                  if (((int)local_8e0 != -1) && (uStack_8c0._4_4_ != (int)local_8e0)) {
                    fprintf(_stderr,"PAM header error: expected DEPTH %d but got DEPTH %d\n");
                    sVar9 = 0;
                  }
                  goto LAB_00108da2;
                }
                local_8b0 = local_8b0 | 0x10;
                uVar2 = 4;
LAB_00108c9c:
                local_8e0 = CONCAT44(local_8e0._4_4_,uVar2);
              }
            }
          }
        }
      }
      sVar9 = 0;
    }
    else {
      sVar9 = ReadLine(local_8d8,sVar9,local_8d0,out,&local_888);
      if ((((sVar9 == 0) ||
           (iVar6 = __isoc99_sscanf(out,"%d %d",&local_8c8,(long)&local_8c8 + 4), iVar6 != 2)) ||
          (sVar9 = ReadLine(local_8d8,sVar9,local_8d0,out,&local_888), sVar9 == 0)) ||
         (iVar6 = __isoc99_sscanf(out,"%d",&local_8b8), iVar6 != 1)) goto LAB_001090f1;
      uStack_8c0 = CONCAT44((uint)(local_8b8._4_4_ != 5) * 2 + 1,(int)uStack_8c0);
    }
LAB_00108da2:
    lVar14 = (long)(int)(uint)local_8c8;
    if (lVar14 < 1) goto LAB_001090f1;
    if ((int)local_8c8._4_4_ < 1) goto LAB_001090f1;
    if ((local_8b8._4_4_ - 9 < 0xfffffff8) || (uStack_8c0._4_4_ - 5 < 0xfffffffc))
    goto LAB_001090f1;
    if ((uint)local_8b8 - 0x10000 < 0xffff0001) goto LAB_001090f1;
    uVar18 = uStack_8c0._4_4_ << (0xff < (uint)local_8b8);
    uStack_8c0 = CONCAT44(uStack_8c0._4_4_,uVar18);
    if (sVar9 == 0) goto LAB_001090f1;
    if (local_8b8._4_4_ - 8 < 0xfffffffd) {
      pcVar19 = "Unsupported P%d PNM format.\n";
LAB_001091bd:
      fprintf(_stderr,pcVar19,(ulong)local_8b8._4_4_);
    }
    else if (pic != (WebPPicture *)0x0) {
      if (((uint)local_8c8 < 0x4000) && (local_8c8._4_4_ < 0x4000)) {
        if (data_size < (ulong)uVar18 * (ulong)local_8c8._4_4_ * lVar14 + sVar9) {
          pcVar19 = "Truncated PNM file (P%d).\n";
          goto LAB_001091bd;
        }
        bVar22 = (uStack_8c0._4_4_ & 5) != 1;
        uVar15 = ((ulong)(keep_alpha != 0 && bVar22) + 3) * lVar14;
        local_890 = local_8b8 & 0xffffffff;
        iVar6 = ImgIoUtilCheckSizeArgumentsOverflow(uVar15,(ulong)local_8c8._4_4_);
        if (iVar6 != 0) {
          iVar6 = local_8c8._4_4_;
          lVar14 = (long)(int)local_8c8._4_4_;
          local_898 = uVar15;
          __dest = (uint8_t *)malloc(uVar15 * lVar14);
          if (__dest != (uint8_t *)0x0) {
            iVar4 = uStack_8c0._4_4_;
            local_868 = (long)(int)((int)uStack_8c0 * (uint)local_8c8);
            uVar18 = (uint)local_8b8;
            bVar23 = (uint)local_8b8 != 0xff;
            bVar24 = uStack_8c0._4_4_ == 3;
            bVar1 = (int)uStack_8c0._4_4_ < 3;
            iVar7 = (int)(uint)local_8b8 / 2;
            uVar8 = uStack_8c0._4_4_ * (uint)local_8c8;
            bVar25 = uStack_8c0._4_4_ == 2;
            bVar3 = uStack_8c0._4_4_ != 4;
            local_878 = (size_t)(int)uVar8;
            uVar13 = 0;
            uVar16 = 0;
            if (0 < (int)uVar8) {
              uVar16 = (ulong)uVar8;
            }
            local_8a8 = (uint)local_8c8;
            local_8e0 = 0;
            if (0 < (int)(uint)local_8c8) {
              local_8e0 = local_8c8 & 0xffffffff;
            }
            local_8a4 = 0;
            if (0 < iVar6) {
              local_8a4 = iVar6;
            }
            puVar10 = __dest + 2;
            puVar21 = data + sVar9;
            uVar20 = local_890;
            uVar15 = local_898;
            local_8a0 = __dest;
            local_880 = lVar14;
            while (__ptr = local_8a0, (int)uVar13 != local_8a4) {
              local_860 = puVar10;
              local_858 = uVar13;
              if (bVar1 || bVar23) {
                iVar6 = 0;
                for (uVar13 = 0; uVar16 != uVar13; uVar13 = uVar13 + 1) {
                  if ((uint)uVar20 < 0x100) {
                    uVar8 = (uint)puVar21[uVar13];
                  }
                  else {
                    uVar8 = (uint)(ushort)(*(ushort *)(puVar21 + uVar13 * 2) << 8 |
                                          *(ushort *)(puVar21 + uVar13 * 2) >> 8);
                  }
                  if (uVar18 != 0xff) {
                    uVar8 = (uVar8 * 0xff + iVar7) / uVar18;
                  }
                  if (0xfe < uVar8) {
                    uVar8 = 0xff;
                  }
                  uVar5 = (uint8_t)uVar8;
                  if (iVar4 < 3) {
                    if ((iVar4 != 1 & (byte)uVar13) == 0) {
                      __dest[(long)iVar6 + 2] = uVar5;
                      __dest[(long)iVar6 + 1] = uVar5;
                      iVar17 = 3;
                      goto LAB_001090b5;
                    }
                    if (bVar25 && keep_alpha != 0) goto LAB_001090b2;
                  }
                  else if ((bVar3 || keep_alpha != 0) || (~(uint)uVar13 & 3) != 0) {
LAB_001090b2:
                    iVar17 = 1;
LAB_001090b5:
                    __dest[iVar6] = uVar5;
                    iVar6 = iVar6 + iVar17;
                  }
                }
              }
              else if (bVar24 || keep_alpha != 0) {
                local_870 = sVar9;
                memcpy(__dest,data + sVar9,local_878);
                sVar9 = local_870;
                uVar20 = local_890;
                uVar15 = local_898;
              }
              else {
                for (uVar13 = 0; local_8e0 != uVar13; uVar13 = uVar13 + 1) {
                  puVar10[-2] = puVar21[uVar13 * 4];
                  puVar10[-1] = puVar21[uVar13 * 4 + 1];
                  *puVar10 = puVar21[uVar13 * 4 + 2];
                  puVar10 = puVar10 + 3;
                }
              }
              sVar9 = sVar9 + local_868;
              __dest = __dest + uVar15;
              puVar21 = puVar21 + local_868;
              puVar10 = local_860 + uVar15;
              uVar13 = (ulong)((int)local_858 + 1);
            }
            pic->width = local_8a8;
            pic->height = (int)local_880;
            if (keep_alpha != 0 && bVar22) {
              iVar6 = WebPPictureImportRGBA(pic,local_8a0,(int)uVar15);
            }
            else {
              iVar6 = WebPPictureImportRGB(pic,local_8a0,(int)uVar15);
            }
            uVar18 = (uint)(iVar6 != 0);
            goto LAB_00109112;
          }
        }
      }
      else {
        fprintf(_stderr,"Invalid %dx%d dimension for PNM\n",lVar14,(ulong)local_8c8._4_4_);
      }
    }
  }
  __ptr = (uint8_t *)0x0;
  uVar18 = 0;
LAB_00109112:
  free(__ptr);
  return uVar18;
}

Assistant:

int ReadPNM(const uint8_t* const data, size_t data_size,
            WebPPicture* const pic, int keep_alpha,
            struct Metadata* const metadata) {
  int ok = 0;
  int i, j;
  uint64_t stride, pixel_bytes, sample_size, depth;
  uint8_t* rgb = NULL, *tmp_rgb;
  size_t offset;
  PNMInfo info;

  info.data = data;
  info.data_size = data_size;
  offset = ReadHeader(&info);
  if (offset == 0) {
    fprintf(stderr, "Error parsing PNM header.\n");
    goto End;
  }

  if (info.type < 5 || info.type > 7) {
    fprintf(stderr, "Unsupported P%d PNM format.\n", info.type);
    goto End;
  }

  // Some basic validations.
  if (pic == NULL) goto End;
  if (info.width > WEBP_MAX_DIMENSION || info.height > WEBP_MAX_DIMENSION) {
    fprintf(stderr, "Invalid %dx%d dimension for PNM\n",
                    info.width, info.height);
    goto End;
  }

  pixel_bytes = (uint64_t)info.width * info.height * info.bytes_per_px;
  if (data_size < offset + pixel_bytes) {
    fprintf(stderr, "Truncated PNM file (P%d).\n", info.type);
    goto End;
  }
  sample_size = (info.max_value > 255) ? 2 : 1;
  // final depth
  depth = (info.depth == 1 || info.depth == 3 || !keep_alpha) ? 3 : 4;
  stride = depth * info.width;
  if (stride != (size_t)stride ||
      !ImgIoUtilCheckSizeArgumentsOverflow(stride, info.height)) {
    goto End;
  }

  rgb = (uint8_t*)malloc((size_t)stride * info.height);
  if (rgb == NULL) goto End;

  // Convert input.
  // We only optimize for the sample_size=1, max_value=255, depth=1 case.
  tmp_rgb = rgb;
  for (j = 0; j < info.height; ++j) {
    const uint8_t* in = data + offset;
    offset += info.bytes_per_px * info.width;
    assert(offset <= data_size);
    if (info.max_value == 255 && info.depth >= 3) {
      // RGB or RGBA
      if (info.depth == 3 || keep_alpha) {
        memcpy(tmp_rgb, in, info.depth * info.width * sizeof(*in));
      } else {
        assert(info.depth == 4 && !keep_alpha);
        for (i = 0; i < info.width; ++i) {
          tmp_rgb[3 * i + 0] = in[4 * i + 0];
          tmp_rgb[3 * i + 1] = in[4 * i + 1];
          tmp_rgb[3 * i + 2] = in[4 * i + 2];
        }
      }
    } else {
      // Unoptimized case, we need to handle non-trivial operations:
      //   * convert 16b to 8b (if max_value > 255)
      //   * rescale to [0..255] range (if max_value != 255)
      //   * drop the alpha channel (if keep_alpha is false)
      const uint32_t round = info.max_value / 2;
      int k = 0;
      for (i = 0; i < info.width * info.depth; ++i) {
        uint32_t v = (sample_size == 2) ? 256u * in[2 * i + 0] + in[2 * i + 1]
                   : in[i];
        if (info.max_value != 255) v = (v * 255u + round) / info.max_value;
        if (v > 255u) v = 255u;
        if (info.depth > 2) {
          if (!keep_alpha && info.depth == 4 && (i % 4) == 3) {
            // skip alpha
          } else {
            tmp_rgb[k] = v;
            k += 1;
          }
        } else if (info.depth == 1 || (i % 2) == 0) {
          tmp_rgb[k + 0] = tmp_rgb[k + 1] = tmp_rgb[k + 2] = v;
          k += 3;
        } else if (keep_alpha && info.depth == 2) {
          tmp_rgb[k] = v;
          k += 1;
        } else {
          // skip alpha
        }
      }
    }
    tmp_rgb += stride;
  }

  // WebP conversion.
  pic->width = info.width;
  pic->height = info.height;
  ok = (depth == 4) ? WebPPictureImportRGBA(pic, rgb, (int)stride)
                    : WebPPictureImportRGB(pic, rgb, (int)stride);
  if (!ok) goto End;

  ok = 1;
 End:
  free((void*)rgb);

  (void)metadata;
  (void)keep_alpha;
  return ok;
}